

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

void tlb_flush_vtlb_page_locked(CPUArchState_conflict30 *env,int mmu_idx,target_ulong_conflict page)

{
  _Bool _Var1;
  target_ulong_conflict page_00;
  target_ulong_conflict extraout_EDX;
  long lVar2;
  long *plVar3;
  
  plVar3 = (long *)((long)env + (long)mmu_idx * 0x2b0 + -0x838);
  page_00 = page;
  for (lVar2 = 0; lVar2 != 0x200; lVar2 = lVar2 + 0x40) {
    _Var1 = tlb_flush_entry_locked
                      ((uc_struct_conflict15 *)((long)env + lVar2 + (long)mmu_idx * 0x2b0 + -0x828),
                       (CPUTLBEntry *)(ulong)page,page_00);
    if (_Var1) {
      *plVar3 = *plVar3 + -1;
    }
    page_00 = extraout_EDX;
  }
  return;
}

Assistant:

static inline void tlb_flush_vtlb_page_locked(CPUArchState *env, int mmu_idx,
                                              target_ulong page)
{
    CPUTLBDesc *d = &env_tlb(env)->d[mmu_idx];
    int k;

    // assert_cpu_is_self(env_cpu(env));
    for (k = 0; k < CPU_VTLB_SIZE; k++) {
        if (tlb_flush_entry_locked(env->uc, &d->vtable[k], page)) {
            tlb_n_used_entries_dec(env, mmu_idx);
        }
    }
}